

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ring.hxx
# Opt level: O2

void __thiscall Ring<unsigned_int>::next(Ring<unsigned_int> *this,uint d)

{
  int iVar1;
  
  flush(this);
  this->ringCacheInvalid = true;
  iVar1 = this->ringCurrentIndex + 1;
  this->ringCurrentIndex = iVar1;
  if (this->ringSize <= iVar1) {
    this->ringCurrentIndex = 0;
    this->ringIsInitialised = true;
    iVar1 = 0;
  }
  this->ringData[iVar1] = d;
  return;
}

Assistant:

void next(T d) {
        flush();
		ringCacheInvalid = true;
		if(++ringCurrentIndex >= ringSize) {
			ringCurrentIndex = 0;
			ringIsInitialised = true;
		}
		ringData[ringCurrentIndex] = d;
    }